

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_io.c
# Opt level: O1

void csp_id_clear(csp_id_t_conflict *target)

{
  target->pri = '\0';
  target->flags = '\0';
  target->src = 0;
  target->dst = 0;
  target->dport = '\0';
  target->sport = '\0';
  return;
}

Assistant:

void csp_id_clear(csp_id_t * target) {
	target->pri = 0;
	target->dst = 0;
	target->src = 0;
	target->dport = 0;
	target->sport = 0;
	target->flags = 0;
}